

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb.c
# Opt level: O0

void av1_foreach_transformed_block_in_plane
               (MACROBLOCKD *xd,BLOCK_SIZE plane_bsize,int plane,
               foreach_transformed_block_visitor visit,void *arg)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  BLOCK_SIZE BVar4;
  uint uVar5;
  uint uVar6;
  code *in_RCX;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  MACROBLOCKD *in_RDI;
  undefined8 in_R8;
  int blk_col;
  int blk_row;
  int unit_width;
  int c;
  int unit_height;
  int r;
  int i;
  int mu_blocks_high;
  int mu_blocks_wide;
  BLOCK_SIZE max_unit_bsize;
  int max_blocks_high;
  int max_blocks_wide;
  int step;
  uint8_t txh_unit;
  uint8_t txw_unit;
  BLOCK_SIZE tx_bsize;
  TX_SIZE tx_size;
  macroblockd_plane *pd;
  uint local_70;
  uint local_6c;
  undefined4 in_stack_ffffffffffffff98;
  uint uVar7;
  undefined4 in_stack_ffffffffffffff9c;
  uint uVar8;
  int in_stack_ffffffffffffffa0;
  int iVar9;
  int local_5c;
  int local_54;
  int local_4c;
  int local_48;
  
  bVar3 = av1_get_tx_size(in_stack_ffffffffffffffa0,
                          (MACROBLOCKD *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  if (in_SIL == txsize_to_bsize[bVar3]) {
    (*in_RCX)(in_EDX,0,0,0,in_SIL,bVar3,in_R8);
  }
  else {
    uVar1 = tx_size_wide_unit[bVar3];
    uVar2 = tx_size_high_unit[bVar3];
    uVar5 = max_block_wide(in_RDI,in_SIL,in_EDX);
    uVar6 = max_block_high(in_RDI,in_SIL,in_EDX);
    BVar4 = get_plane_block_size
                      (BLOCK_64X64,in_RDI->plane[in_EDX].subsampling_x,
                       in_RDI->plane[in_EDX].subsampling_y);
    uVar8 = uVar5;
    if ((int)(uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                   [BVar4] < (int)uVar5) {
      uVar8 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                    [BVar4];
    }
    uVar7 = uVar6;
    if ((int)(uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                   [BVar4] < (int)uVar6) {
      uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                    [BVar4];
    }
    local_48 = 0;
    for (local_4c = 0; local_4c < (int)uVar6; local_4c = uVar7 + local_4c) {
      local_6c = uVar6;
      if ((int)(uVar7 + local_4c) < (int)uVar6) {
        local_6c = uVar7 + local_4c;
      }
      for (local_54 = 0; local_54 < (int)uVar5; local_54 = uVar8 + local_54) {
        local_70 = uVar5;
        if ((int)(uVar8 + local_54) < (int)uVar5) {
          local_70 = uVar8 + local_54;
        }
        for (local_5c = local_4c; iVar9 = local_54, local_5c < (int)local_6c;
            local_5c = (uVar2 & 0xff) + local_5c) {
          for (; iVar9 < (int)local_70; iVar9 = (uVar1 & 0xff) + iVar9) {
            (*in_RCX)(in_EDX,local_48,local_5c,iVar9,in_SIL,bVar3,in_R8);
            local_48 = (uVar1 & 0xff) * (uVar2 & 0xff) + local_48;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void av1_foreach_transformed_block_in_plane(
    const MACROBLOCKD *const xd, BLOCK_SIZE plane_bsize, int plane,
    foreach_transformed_block_visitor visit, void *arg) {
  const struct macroblockd_plane *const pd = &xd->plane[plane];
  // block and transform sizes, in number of 4x4 blocks log 2 ("*_b")
  // 4x4=0, 8x8=2, 16x16=4, 32x32=6, 64x64=8
  // transform size varies per plane, look it up in a common way.
  const TX_SIZE tx_size = av1_get_tx_size(plane, xd);
  const BLOCK_SIZE tx_bsize = txsize_to_bsize[tx_size];
  // Call visit() directly with zero offsets if the current block size is the
  // same as the transform block size.
  if (plane_bsize == tx_bsize) {
    visit(plane, 0, 0, 0, plane_bsize, tx_size, arg);
    return;
  }
  const uint8_t txw_unit = tx_size_wide_unit[tx_size];
  const uint8_t txh_unit = tx_size_high_unit[tx_size];
  const int step = txw_unit * txh_unit;

  // If mb_to_right_edge is < 0 we are in a situation in which
  // the current block size extends into the UMV and we won't
  // visit the sub blocks that are wholly within the UMV.
  const int max_blocks_wide = max_block_wide(xd, plane_bsize, plane);
  const int max_blocks_high = max_block_high(xd, plane_bsize, plane);
  const BLOCK_SIZE max_unit_bsize =
      get_plane_block_size(BLOCK_64X64, pd->subsampling_x, pd->subsampling_y);
  const int mu_blocks_wide =
      AOMMIN(mi_size_wide[max_unit_bsize], max_blocks_wide);
  const int mu_blocks_high =
      AOMMIN(mi_size_high[max_unit_bsize], max_blocks_high);

  // Keep track of the row and column of the blocks we use so that we know
  // if we are in the unrestricted motion border.
  int i = 0;
  for (int r = 0; r < max_blocks_high; r += mu_blocks_high) {
    const int unit_height = AOMMIN(mu_blocks_high + r, max_blocks_high);
    // Skip visiting the sub blocks that are wholly within the UMV.
    for (int c = 0; c < max_blocks_wide; c += mu_blocks_wide) {
      const int unit_width = AOMMIN(mu_blocks_wide + c, max_blocks_wide);
      for (int blk_row = r; blk_row < unit_height; blk_row += txh_unit) {
        for (int blk_col = c; blk_col < unit_width; blk_col += txw_unit) {
          visit(plane, i, blk_row, blk_col, plane_bsize, tx_size, arg);
          i += step;
        }
      }
    }
  }
  // Check if visit() is invoked at least once.
  assert(i >= 1);
}